

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_patch.c
# Opt level: O2

int json_patch_apply_move_copy
              (json_object **res,json_object *patch_elem,char *path,int move,
              json_patch_error *patch_error)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t __n;
  int *piVar4;
  size_t sVar5;
  code *array_set_cb;
  json_object *jfrom;
  json_pointer_get_result from;
  
  iVar2 = json_object_object_get_ex(patch_elem,"from",&jfrom);
  if (iVar2 == 0) {
    patch_error->errno_code = 0x16;
    pcVar3 = "Patch does not contain a \'from\' field";
LAB_0010a036:
    patch_error->errmsg = pcVar3;
    piVar4 = __errno_location();
    *piVar4 = 0;
    return -1;
  }
  pcVar3 = json_object_get_string(jfrom);
  __n = strlen(pcVar3);
  iVar2 = strncmp(pcVar3,path,__n);
  if (iVar2 == 0) {
    sVar5 = strlen(path);
    if (__n != sVar5) {
      patch_error->errno_code = 0x16;
      pcVar3 = "Invalid attempt to move parent under a child";
      goto LAB_0010a036;
    }
LAB_0010a0a7:
    iVar2 = 0;
  }
  else {
    iVar2 = json_pointer_get_internal(*res,pcVar3,&from);
    if (iVar2 != 0) {
      piVar4 = __errno_location();
      iVar1 = *piVar4;
      patch_error->errno_code = iVar1;
      pcVar3 = "Invalid from field";
      if (iVar1 == 2) {
        pcVar3 = "Did not find element referenced by from field";
      }
      patch_error->errmsg = pcVar3;
      *piVar4 = 0;
      return iVar2;
    }
    json_object_get(from.obj);
    if (move == 0) {
      array_set_cb = json_object_array_insert_idx_cb;
LAB_0010a074:
      iVar2 = json_pointer_set_with_array_cb(res,path,from.obj,array_set_cb,&from);
      if (iVar2 == 0) goto LAB_0010a0a7;
      piVar4 = __errno_location();
      patch_error->errno_code = *piVar4;
      patch_error->errmsg = "Failed to set value at path referenced by \'path\' field";
      *piVar4 = 0;
    }
    else {
      iVar2 = __json_patch_apply_remove(&from);
      if (-1 < iVar2) {
        array_set_cb = json_object_array_move_cb;
        goto LAB_0010a074;
      }
    }
    json_object_put(from.obj);
  }
  return iVar2;
}

Assistant:

static int json_patch_apply_move_copy(struct json_object **res,
                                      struct json_object *patch_elem,
                                      const char *path, int move, struct json_patch_error *patch_error)
{
	json_pointer_array_set_cb array_set_cb;
	struct json_pointer_get_result from;
	struct json_object *jfrom;
	const char *from_s;
	size_t from_s_len;
	int rc;

	if (!json_object_object_get_ex(patch_elem, "from", &jfrom)) {
		_set_err(EINVAL, "Patch does not contain a 'from' field");
		return -1;
	}

	from_s = json_object_get_string(jfrom);

	from_s_len = strlen(from_s);
	if (strncmp(from_s, path, from_s_len) == 0) {
		/**
		 * If lengths match, it's a noop, if they don't,
		 * then we're trying to move a parent under a child
		 * which is not allowed as per RFC 6902 section 4.4
		 *   The "from" location MUST NOT be a proper prefix of the "path"
		 *   location; i.e., a location cannot be moved into one of its children.
		 */
		if (from_s_len == strlen(path))
			return 0;
		_set_err(EINVAL, "Invalid attempt to move parent under a child");
		return -1;
	}

	rc = json_pointer_get_internal(*res, from_s, &from);
	if (rc)
	{
		_set_err_from_ptrget(errno, "from");
		return rc;
	}

	// Note: it's impossible for json_pointer to find the root obj, due
	// to the path check above, so from.parent is guaranteed non-NULL
	json_object_get(from.obj);

	if (!move) {
		array_set_cb = json_object_array_insert_idx_cb;
	} else {
		rc = __json_patch_apply_remove(&from);
		if (rc < 0) {
			json_object_put(from.obj);
			return rc;
		}
		array_set_cb = json_object_array_move_cb;
	}

	rc = json_pointer_set_with_array_cb(res, path, from.obj, array_set_cb, &from);
	if (rc)
	{
		_set_err(errno, "Failed to set value at path referenced by 'path' field");
		json_object_put(from.obj);
	}

	return rc;
}